

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O3

void Gia_ManResubTest(Gia_Man_t *p)

{
  Vec_Int_t *__ptr;
  void *__ptr_00;
  int iVar1;
  Gia_Man_t *p_00;
  Vec_Wec_t *vMffcs;
  long lVar2;
  long lVar3;
  int level;
  timespec ts;
  timespec local_40;
  
  p_00 = Gia_ManDupMuxes(p,2);
  iVar1 = clock_gettime(3,&local_40);
  if (iVar1 < 0) {
    lVar2 = 1;
  }
  else {
    lVar2 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    lVar2 = ((lVar2 >> 7) - (lVar2 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  vMffcs = Gia_ManComputeMffcs(p_00,4,100,8,100);
  Gia_ManAddDivisors(p_00,vMffcs);
  iVar1 = vMffcs->nCap;
  __ptr = vMffcs->pArray;
  if ((long)iVar1 < 1) {
    if (__ptr == (Vec_Int_t *)0x0) goto LAB_0074bed2;
  }
  else {
    lVar3 = 0;
    do {
      __ptr_00 = *(void **)((long)&__ptr->pArray + lVar3);
      if (__ptr_00 != (void *)0x0) {
        free(__ptr_00);
        *(undefined8 *)((long)&__ptr->pArray + lVar3) = 0;
      }
      lVar3 = lVar3 + 0x10;
    } while ((long)iVar1 * 0x10 != lVar3);
  }
  free(__ptr);
LAB_0074bed2:
  free(vMffcs);
  level = 3;
  iVar1 = clock_gettime(3,&local_40);
  if (iVar1 < 0) {
    lVar3 = -1;
  }
  else {
    lVar3 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
  }
  Abc_Print(level,"%s =","Time");
  Abc_Print(level,"%9.2f sec\n",(double)(lVar3 + lVar2) / 1000000.0);
  Gia_ManStop(p_00);
  return;
}

Assistant:

void Gia_ManResubTest( Gia_Man_t * p )
{
    Vec_Wec_t * vMffcs;
    Gia_Man_t * pNew = Gia_ManDupMuxes( p, 2 );
abctime clkStart = Abc_Clock();
    vMffcs = Gia_ManComputeMffcs( pNew, 4, 100, 8, 100 );
    Gia_ManAddDivisors( pNew, vMffcs );
    Vec_WecFree( vMffcs );
Abc_PrintTime( 1, "Time", Abc_Clock() - clkStart );
    Gia_ManStop( pNew );
}